

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,AddressType addr_type,ByteData160 *hash)

{
  CfdException *this_00;
  allocator local_71;
  string local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  allocator local_21;
  ByteData160 *local_20;
  ByteData160 *hash_local;
  AddressType addr_type_local;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = addr_type;
  this->witness_ver_ = kVersionNone;
  local_20 = hash;
  hash_local._0_4_ = addr_type;
  hash_local._4_4_ = type;
  _addr_type_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_21);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  ByteData160::GetBytes(&local_50,local_20);
  ByteData::ByteData(&this->hash_,&local_50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  memset(this->checksum_,0,4);
  if ((AddressType)hash_local == kP2pkhAddress) {
    CalculateP2PKH(this,local_20,'\0');
  }
  else {
    if ((((AddressType)hash_local != kP2shAddress) && ((AddressType)hash_local != kP2shP2wshAddress)
        ) && ((AddressType)hash_local != kP2shP2wpkhAddress)) {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_70,"Support addressType is p2pkh or p2sh",&local_71);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_70);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    CalculateP2SH(this,local_20,'\0');
  }
  return;
}

Assistant:

Address::Address(NetType type, AddressType addr_type, const ByteData160& hash)
    : type_(type),
      addr_type_(addr_type),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(hash.GetBytes()),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  if (addr_type == kP2pkhAddress) {
    CalculateP2PKH(hash);
  } else if (
      (addr_type == kP2shAddress) || (addr_type == kP2shP2wshAddress) ||
      (addr_type == kP2shP2wpkhAddress)) {
    CalculateP2SH(hash);
  } else {
    throw CfdException(
        kCfdIllegalArgumentError, "Support addressType is p2pkh or p2sh");
  }
}